

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseCompiler::_newReg(BaseCompiler *this,BaseReg *out,TypeId typeId,char *name)

{
  uint32_t uVar1;
  Error EVar2;
  OperandSignature regSignature;
  VirtReg *vReg;
  TypeId local_25;
  OperandSignature local_24;
  VirtReg *local_20;
  
  (out->super_Operand).super_Operand_._signature = 0;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  local_25 = typeId;
  EVar2 = ArchUtils::typeIdToRegSignature
                    ((this->super_BaseBuilder).super_BaseEmitter._environment._arch,typeId,&local_25
                     ,&local_24);
  if (EVar2 == 0) {
    EVar2 = newVirtReg(this,&local_20,local_25,local_24,name);
    if (EVar2 == 0) {
      uVar1 = *(uint32_t *)(local_20 + 4);
      (out->super_Operand).super_Operand_._signature._bits = local_24._bits;
      (out->super_Operand).super_Operand_._baseId = uVar1;
      (out->super_Operand).super_Operand_._data[0] = 0;
      (out->super_Operand).super_Operand_._data[1] = 0;
      EVar2 = 0;
    }
  }
  else {
    EVar2 = BaseEmitter::reportError((BaseEmitter *)this,EVar2,(char *)0x0);
  }
  return EVar2;
}

Assistant:

Error BaseCompiler::_newReg(BaseReg* out, TypeId typeId, const char* name) {
  OperandSignature regSignature;
  out->reset();

  Error err = ArchUtils::typeIdToRegSignature(arch(), typeId, &typeId, &regSignature);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, typeId, regSignature, name));
  ASMJIT_ASSUME(vReg != nullptr);

  out->_initReg(regSignature, vReg->id());
  return kErrorOk;
}